

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::Lookup(PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
         *this,interval_t *value)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  interval_t *in_RSI;
  interval_t *in_RDI;
  uint64_t offset;
  uint7 in_stack_ffffffffffffffc8;
  bool bVar4;
  ulong local_18;
  
  local_18 = duckdb::Hash<duckdb::interval_t>(*in_RSI);
  uVar1._0_4_ = in_RDI[2].months;
  uVar1._4_4_ = in_RDI[2].days;
  local_18 = local_18 & uVar1;
  while( true ) {
    bVar3 = primitive_dictionary_entry_t::IsEmpty
                      ((primitive_dictionary_entry_t *)(*(long *)(in_RDI + 9) + local_18 * 0x18));
    bVar4 = false;
    if (!bVar3) {
      bVar4 = interval_t::operator!=(in_RDI,(interval_t *)(ulong)in_stack_ffffffffffffffc8);
    }
    if (bVar4 == false) break;
    uVar2._0_4_ = in_RDI[2].months;
    uVar2._4_4_ = in_RDI[2].days;
    local_18 = uVar2 & local_18 + 1;
  }
  return (primitive_dictionary_entry_t *)(*(long *)(in_RDI + 9) + local_18 * 0x18);
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}